

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chai-serialization.hpp
# Opt level: O0

void henson::Serialization<chaiscript::Boxed_Value>::load(BinaryBuffer *bb,Boxed_Value *bv)

{
  Address address_;
  runtime_error *this;
  Array a;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> v;
  string s_1;
  size_t s;
  double d;
  float f;
  int i;
  int tag;
  Array *in_stack_fffffffffffffe98;
  variant<void_*,_float_*,_double_*,_int_*,_long_*> *in_stack_fffffffffffffea0;
  Array *in_stack_fffffffffffffeb0;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *this_00;
  data_t in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffed7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  Boxed_Value *in_stack_fffffffffffffee0;
  undefined1 local_110 [7];
  undefined1 in_stack_fffffffffffffef7;
  Array *in_stack_fffffffffffffef8;
  Boxed_Value *in_stack_ffffffffffffff00;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_c8 [2];
  string local_90 [124];
  int local_14;
  
  load<int>((BinaryBuffer *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98);
  if (local_14 == 0) {
    load<int>((BinaryBuffer *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<int&,void>
              ((Boxed_Value *)in_stack_fffffffffffffea0,(int *)in_stack_fffffffffffffe98,false);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d2f4);
  }
  else if (local_14 == 1) {
    load<float>((BinaryBuffer *)in_stack_fffffffffffffea0,(float *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<float&,void>
              ((Boxed_Value *)in_stack_fffffffffffffea0,(float *)in_stack_fffffffffffffe98,false);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d351);
  }
  else if (local_14 == 2) {
    load<double>((BinaryBuffer *)in_stack_fffffffffffffea0,(double *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<double&,void>
              ((Boxed_Value *)in_stack_fffffffffffffea0,(double *)in_stack_fffffffffffffe98,false);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d3ae);
  }
  else if (local_14 == 3) {
    load<unsigned_long>((BinaryBuffer *)in_stack_fffffffffffffea0,
                        (unsigned_long *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<unsigned_long&,void>
              ((Boxed_Value *)in_stack_fffffffffffffea0,(unsigned_long *)in_stack_fffffffffffffe98,
               false);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d40b);
  }
  else if (local_14 == 4) {
    std::__cxx11::string::string(local_90);
    load<std::__cxx11::string>
              ((BinaryBuffer *)in_stack_fffffffffffffea0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(bool)in_stack_fffffffffffffed7);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d47f);
    std::__cxx11::string::~string(local_90);
  }
  else if (local_14 == 6) {
    this_00 = local_c8;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)0x32d4d7
              );
    load<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
              ((BinaryBuffer *)in_stack_fffffffffffffea0,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::
    Boxed_Value<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,void>
              (in_stack_fffffffffffffee0,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               in_stack_fffffffffffffed8,(bool)in_stack_fffffffffffffed7);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d526);
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(this_00)
    ;
  }
  else if (local_14 == 5) {
    mpark::variant<void_*,_float_*,_double_*,_int_*,_long_*>::variant<void_*,_0>
              (in_stack_fffffffffffffea0);
    address_.impl_.
    super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .
    super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
    super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .
    super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
    super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>._8_8_ =
         in_stack_fffffffffffffec0;
    address_.impl_.
    super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .
    super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
    super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .
    super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
    super_destructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
    .super_base<(mpark::detail::Trait)0,_void_*,_float_*,_double_*,_int_*,_long_*>.data_ =
         in_stack_fffffffffffffeb8;
    Array::Array(in_stack_fffffffffffffeb0,address_,(size_t)local_110,
                 (size_t)in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
    load<henson::Array>((BinaryBuffer *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::Boxed_Value<henson::Array&,void>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(bool)in_stack_fffffffffffffef7);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d5dc);
    Array::~Array((Array *)0x32d5e6);
  }
  else {
    if (local_14 != 7) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot deserialize a boxed value");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    chaiscript::Boxed_Value::Boxed_Value((Boxed_Value *)0x32d622);
    chaiscript::Boxed_Value::operator=
              ((Boxed_Value *)in_stack_fffffffffffffea0,(Boxed_Value *)in_stack_fffffffffffffe98);
    chaiscript::Boxed_Value::~Boxed_Value((Boxed_Value *)0x32d63e);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, chaiscript::Boxed_Value& bv)
        {
            int tag;
            henson::load(bb, tag);
            if (tag == tags::int_)
            {
                int i;
                henson::load(bb, i);
                bv = chaiscript::Boxed_Value(i);
            } else if (tag == tags::float_)
            {
                float f;
                henson::load(bb, f);
                bv = chaiscript::Boxed_Value(f);
            } else if (tag == tags::double_)
            {
                double d;
                henson::load(bb, d);
                bv = chaiscript::Boxed_Value(d);
            } else if (tag == tags::size_t_)
            {
                size_t s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::string_)
            {
                std::string s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::vector_)
            {
                std::vector<chaiscript::Boxed_Value> v;
                henson::load(bb, v);
                bv = chaiscript::Boxed_Value(v);
            } else if (tag == tags::array_)
            {
                Array a;
                henson::load(bb, a);
                bv = chaiscript::Boxed_Value(a);
            } else if (tag == tags::undef_)
                bv = chaiscript::Boxed_Value();
            else
                throw std::runtime_error("Cannot deserialize a boxed value");
        }